

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

object_ptr __thiscall mjs::global_object::make_object(global_object *this)

{
  size_t num_bytes;
  undefined8 extraout_RDX;
  long *in_RSI;
  object_ptr oVar1;
  object_ptr op;
  undefined1 auStack_38 [32];
  
  (**(code **)(*in_RSI + 0x58))((gc_heap_ptr_untyped *)(auStack_38 + 0x10));
  num_bytes = in_RSI[1];
  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_38 + 0x10));
  object::class_name((object *)auStack_38);
  gc_heap::allocate_and_construct<mjs::object,mjs::string,mjs::gc_heap_ptr<mjs::object>&>
            ((gc_heap *)this,num_bytes,(string *)0x20,(gc_heap_ptr<mjs::object> *)auStack_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_38 + 0x10));
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr global_object::make_object() {
    auto op = object_prototype();
    return heap().make<object>(op->class_name(), op);
}